

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udp.c
# Opt level: O3

int udp_pipe_start(udp_pipe *p,udp_ep *ep,nng_sockaddr *sa)

{
  _Bool _Var1;
  nng_duration nVar2;
  uint32_t uVar3;
  int iVar4;
  nni_time nVar5;
  long lVar6;
  
  nVar5 = nni_clock();
  p->ep = ep;
  p->proto = ep->proto;
  memcpy(&p->peer_addr,sa,0x88);
  _Var1 = ep->dialer;
  p->dialer = _Var1;
  nVar2 = 200;
  if (_Var1 == false) {
    nVar2 = ep->refresh;
  }
  p->refresh = nVar2;
  p->rcvmax = ep->rcvmax;
  uVar3 = nni_random();
  p->self_seq = uVar3;
  lVar6 = 5000;
  if (p->dialer == false) {
    lVar6 = (long)p->refresh * 5;
  }
  p->expire = lVar6 + nVar5;
  iVar4 = nni_id_alloc32(&ep->pipes,&p->self_id,p);
  return iVar4;
}

Assistant:

static int
udp_pipe_start(udp_pipe *p, udp_ep *ep, nng_sockaddr *sa)
{
	nni_time now = nni_clock();
	p->ep        = ep;
	p->proto     = ep->proto;
	p->peer_addr = *sa;
	p->dialer    = ep->dialer;
	p->refresh   = p->dialer ? NNG_UDP_CONNRETRY : ep->refresh;
	p->rcvmax    = ep->rcvmax;
	p->self_seq  = nni_random();
	p->expire = now + (p->dialer ? (5 * NNI_SECOND) : UDP_PIPE_TIMEOUT(p));
	return (nni_id_alloc32(&ep->pipes, &p->self_id, p));
}